

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsHessianUtils.cpp
# Opt level: O0

void reportHessian(HighsLogOptions *log_options,HighsInt dim,HighsInt num_nz,HighsInt *start,
                  HighsInt *index,double *value)

{
  long in_RCX;
  uint in_EDX;
  int in_ESI;
  HighsLogOptions *in_RDI;
  long in_R8;
  long in_R9;
  HighsInt el;
  HighsInt to_el;
  HighsInt col;
  uint local_38;
  int local_34;
  uint local_2c;
  
  if (0 < in_ESI) {
    highsLogUser(in_RDI,kInfo,"Hessian Index              Value\n");
    for (local_2c = 0; (int)local_2c < in_ESI; local_2c = local_2c + 1) {
      highsLogUser(in_RDI,kInfo,"    %8d Start   %10d\n",(ulong)local_2c,
                   (ulong)*(uint *)(in_RCX + (long)(int)local_2c * 4));
      local_38 = in_EDX;
      if ((int)local_2c < in_ESI + -1) {
        local_38 = *(uint *)(in_RCX + (long)(int)(local_2c + 1) * 4);
      }
      for (local_34 = *(int *)(in_RCX + (long)(int)local_2c * 4); local_34 < (int)local_38;
          local_34 = local_34 + 1) {
        highsLogUser(*(HighsLogOptions **)(in_R9 + (long)local_34 * 8),(HighsLogType)in_RDI,
                     (char *)0x1,"          %8d %12g\n",(ulong)*(uint *)(in_R8 + (long)local_34 * 4)
                    );
      }
    }
    highsLogUser(in_RDI,kInfo,"             Start   %10d\n",(ulong)in_EDX);
  }
  return;
}

Assistant:

void reportHessian(const HighsLogOptions& log_options, const HighsInt dim,
                   const HighsInt num_nz, const HighsInt* start,
                   const HighsInt* index, const double* value) {
  if (dim <= 0) return;
  highsLogUser(log_options, HighsLogType::kInfo,
               "Hessian Index              Value\n");
  for (HighsInt col = 0; col < dim; col++) {
    highsLogUser(log_options, HighsLogType::kInfo,
                 "    %8" HIGHSINT_FORMAT " Start   %10" HIGHSINT_FORMAT "\n",
                 col, start[col]);
    HighsInt to_el = (col < dim - 1 ? start[col + 1] : num_nz);
    for (HighsInt el = start[col]; el < to_el; el++)
      highsLogUser(log_options, HighsLogType::kInfo,
                   "          %8" HIGHSINT_FORMAT " %12g\n", index[el],
                   value[el]);
  }
  highsLogUser(log_options, HighsLogType::kInfo,
               "             Start   %10" HIGHSINT_FORMAT "\n", num_nz);
}